

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O3

LLVMPointerAnalysisOptions *
dg::DGLLVMPointerAnalysis::createOptions
          (LLVMPointerAnalysisOptions *__return_storage_ptr__,char *entry_func,
          uint64_t field_sensitivity,bool threads)

{
  allocator local_41;
  long *local_40 [2];
  long local_30 [2];
  
  (__return_storage_ptr__->super_LLVMAnalysisOptions).entryFunction._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_LLVMAnalysisOptions).entryFunction.field_2;
  *(undefined4 *)&(__return_storage_ptr__->super_LLVMAnalysisOptions).entryFunction.field_2 =
       0x6e69616d;
  (__return_storage_ptr__->super_LLVMAnalysisOptions).entryFunction._M_string_length = 4;
  (__return_storage_ptr__->super_LLVMAnalysisOptions).entryFunction.field_2._M_local_buf[4] = '\0';
  AnalysisOptions::AnalysisOptions
            (&(__return_storage_ptr__->super_PointerAnalysisOptions).super_AnalysisOptions);
  (__return_storage_ptr__->super_PointerAnalysisOptions).preprocessGeps = true;
  (__return_storage_ptr__->super_PointerAnalysisOptions).invalidateNodes = false;
  (__return_storage_ptr__->super_PointerAnalysisOptions).maxIterations = 0;
  __return_storage_ptr__->analysisType = fi;
  __return_storage_ptr__->threads = threads;
  (__return_storage_ptr__->super_PointerAnalysisOptions).super_AnalysisOptions.fieldSensitivity.
  offset = field_sensitivity;
  std::__cxx11::string::string((string *)local_40,entry_func,&local_41);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static LLVMPointerAnalysisOptions createOptions(const char *entry_func,
                                                    uint64_t field_sensitivity,
                                                    bool threads = false) {
        LLVMPointerAnalysisOptions opts;
        opts.threads = threads;
        opts.setFieldSensitivity(field_sensitivity);
        opts.setEntryFunction(entry_func);
        return opts;
    }